

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Type> *
wasm::WATParser::valtype<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::Type> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  bool bVar1;
  Type *u;
  Err local_a0;
  Err *local_80;
  Err *err;
  MaybeResult<wasm::Type> _val;
  undefined1 local_40 [8];
  MaybeResult<wasm::Type> type;
  ParseModuleTypesCtx *ctx_local;
  
  type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._32_8_ = ctx;
  tupletype<wasm::WATParser::ParseModuleTypesCtx>((MaybeResult<wasm::Type> *)local_40,ctx);
  bVar1 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)local_40);
  if (bVar1) {
    MaybeResult<wasm::Type>::MaybeResult
              ((MaybeResult<wasm::Type> *)&err,(MaybeResult<wasm::Type> *)local_40);
    local_80 = MaybeResult<wasm::Type>::getErr((MaybeResult<wasm::Type> *)&err);
    bVar1 = local_80 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_a0,local_80);
      Result<wasm::Type>::Result(__return_storage_ptr__,&local_a0);
      wasm::Err::~Err(&local_a0);
    }
    MaybeResult<wasm::Type>::~MaybeResult((MaybeResult<wasm::Type> *)&err);
    if (!bVar1) {
      u = MaybeResult<wasm::Type>::operator*((MaybeResult<wasm::Type> *)local_40);
      Result<wasm::Type>::Result<wasm::Type&>(__return_storage_ptr__,u);
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  MaybeResult<wasm::Type>::~MaybeResult((MaybeResult<wasm::Type> *)local_40);
  if (!bVar1) {
    singlevaltype<wasm::WATParser::ParseModuleTypesCtx>
              (__return_storage_ptr__,
               (ParseModuleTypesCtx *)
               type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._32_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeT> valtype(Ctx& ctx) {
  if (auto type = tupletype(ctx)) {
    CHECK_ERR(type);
    return *type;
  }
  return singlevaltype(ctx);
}